

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script_object
          (LinkedObjectFile *this,int seg,int byte_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  uint byte_idx_00;
  bool bVar1;
  reference this_00;
  reference word;
  reference pvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  LinkedObjectFile *this_01;
  shared_ptr<Form> sVar4;
  string debug;
  __shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined8 local_38;
  
  this_01 = (LinkedObjectFile *)CONCAT44(in_register_00000034,seg);
  (this->stats).total_code_bytes = 0;
  (this->stats).total_v2_code_bytes = 0;
  (this->stats).total_v2_pointers = 0;
  (this->stats).total_v2_pointer_seeks = 0;
  if (((ulong)seen & 3) != 0) {
    printf("align %d\n",(ulong)((uint)seen & 7));
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x328,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                 );
  }
  this_00 = std::
            vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
            ::at(&this_01->words_by_seg,(long)byte_idx);
  word = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                   (this_00,(long)(int)((long)((ulong)(uint)((int)(uint)seen >> 0x1f) << 0x20 |
                                              (ulong)seen & 0xffffffff) / 4));
  switch(word->kind) {
  case PLAIN_DATA:
    std::__cxx11::to_string(&debug,word->data);
    toForm((string *)&local_48);
LAB_0013bcc6:
    std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)this,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::__cxx11::string::~string((string *)&debug);
    _Var3._M_pi = extraout_RDX;
    goto LAB_0013bde5;
  case PTR:
    local_38 = &this_01->labels;
    pvVar2 = std::vector<Label,_std::allocator<Label>_>::at
                       ((vector<Label,_std::allocator<Label>_> *)local_38,(long)word->label_id);
    byte_idx_00 = pvVar2->offset;
    if ((byte_idx_00 & 7) == 2) {
      to_form_script((LinkedObjectFile *)&debug,seg,byte_idx,
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)(int)byte_idx_00 / 4 & 0xffffffff));
    }
    else {
      bVar1 = is_string(this_01,byte_idx,byte_idx_00);
      if (bVar1) {
        get_goal_string_abi_cxx11_(&debug,this_01,byte_idx,(int)byte_idx_00 / 4 + -1);
        toForm((string *)&local_48);
        goto LAB_0013bcc6;
      }
      std::vector<Label,_std::allocator<Label>_>::at
                ((vector<Label,_std::allocator<Label>_> *)local_38,(long)word->label_id);
      toForm(&debug);
    }
    break;
  default:
    debug._M_dataplus._M_p = (pointer)&debug.field_2;
    debug._M_string_length = 0;
    debug.field_2._M_local_buf[0] = '\0';
    append_word_to_string(this_01,&debug,word);
    printf("don\'t know how to print %s\n",debug._M_dataplus._M_p);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,800,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int, int, std::vector<bool> &)"
                 );
  case SYM_PTR:
    toForm(&debug);
    break;
  case EMPTY_PTR:
    std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)&debug,
               &gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)&debug);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&debug._M_string_length);
  _Var3._M_pi = extraout_RDX_00;
LAB_0013bde5:
  sVar4.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Form>)sVar4.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script_object(int seg,
                                                              int byte_idx,
                                                              std::vector<bool>& seen) {
  std::shared_ptr<Form> result;

  switch (byte_idx & 7) {
    case 0:
    case 4: {
      auto& word = words_by_seg.at(seg).at(byte_idx / 4);
      if (word.kind == LinkedWord::SYM_PTR) {
        // .symbol xxxx
        result = toForm(word.symbol_name);
      } else if (word.kind == LinkedWord::PLAIN_DATA) {
        // .word xxxxx
        result = toForm(std::to_string(word.data));
      } else if (word.kind == LinkedWord::PTR) {
        // might be a sub-list, or some other random pointer
        auto offset = labels.at(word.label_id).offset;
        if ((offset & 7) == 2) {
          // list!
          result = to_form_script(seg, offset / 4, seen);
        } else {
          if (is_string(seg, offset)) {
            result = toForm(get_goal_string(seg, offset / 4 - 1));
          } else {
            // some random pointer, just print the label.
            result = toForm(labels.at(word.label_id).name);
          }
        }
      } else if (word.kind == LinkedWord::EMPTY_PTR) {
        result = gSymbolTable.getEmptyPair();
      } else {
        std::string debug;
        append_word_to_string(debug, word);
        printf("don't know how to print %s\n", debug.c_str());
        assert(false);
      }
    } break;

    case 2:  // bad, a pair snuck through.
    default:
      // pointers should be aligned!
      printf("align %d\n", byte_idx & 7);
      assert(false);
  }

  return result;
}